

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall FakeTokenCommandRunner::~FakeTokenCommandRunner(FakeTokenCommandRunner *this)

{
  (this->super_CommandRunner)._vptr_CommandRunner =
       (_func_int **)&PTR__FakeTokenCommandRunner_001e0428;
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&(this->wait_for_command_).super__Bvector_base<std::allocator<bool>_>);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&(this->can_run_more_).super__Bvector_base<std::allocator<bool>_>);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&(this->acquire_token_).super__Bvector_base<std::allocator<bool>_>);
  std::_Vector_base<Edge_*,_std::allocator<Edge_*>_>::~_Vector_base
            (&(this->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->commands_ran_);
  return;
}

Assistant:

explicit FakeTokenCommandRunner() {}